

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int automataTest(char *filename,char *result,char *err,int options)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  FILE *__s;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  int iVar12;
  long lVar13;
  char *extraout_RDX;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  char expr [5000];
  xmlAutomataStatePtr states [1000];
  char acStack_3770 [499];
  undefined1 uStack_357d;
  char acStack_3570 [512];
  char *pcStack_3370;
  char *pcStack_3368;
  long local_3348;
  long local_3328;
  undefined8 local_3310;
  char local_3308 [5008];
  long local_1f78 [1001];
  
  nb_tests = nb_tests + 1;
  memset(local_1f78,0,8000);
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
  }
  else {
    pcVar15 = "";
    pcVar6 = filename;
    pcVar4 = resultFilename(filename,"",".res");
    if (pcVar4 == (char *)0x0) {
      automataTest_cold_5();
      pcStack_3370 = filename;
      pcStack_3368 = result;
      pcVar4 = baseFilename(pcVar6);
      pcVar6 = ".tmp";
      if (extraout_RDX != (char *)0x0) {
        pcVar6 = extraout_RDX;
      }
      pcVar14 = "";
      if (pcVar15 != (char *)0x0) {
        pcVar14 = pcVar15;
      }
      strncpy(acStack_3570,pcVar6,499);
      iVar3 = snprintf(acStack_3770,499,"%s%s%s",pcVar14,pcVar4,acStack_3570);
      if (0x1f2 < iVar3) {
        uStack_357d = 0;
      }
      pcVar6 = strdup(acStack_3770);
      return (int)pcVar6;
    }
    __s = fopen64(pcVar4,"wb");
    if (__s == (FILE *)0x0) {
      automataTest_cold_4();
    }
    else {
      lVar5 = xmlNewAutomata();
      if (lVar5 == 0) {
        automataTest_cold_3();
      }
      else {
        local_1f78[0] = xmlAutomataGetInitState(lVar5);
        if (local_1f78[0] != 0) {
          local_3328 = 0;
          local_3310 = filename;
LAB_0010bf35:
          local_3348 = 0;
LAB_0010bf3e:
          iVar3 = 0;
LAB_0010bf47:
          do {
            pcVar6 = fgets(local_3308,0x1194,__stream);
            cVar2 = local_3308[0];
            if (pcVar6 == (char *)0x0) {
LAB_0010c5c9:
              fclose(__s);
              fclose(__stream);
              if (local_3348 != 0) {
                xmlRegFreeRegexp(local_3348);
              }
              if (local_3328 != 0) {
                xmlRegFreeExecCtxt();
              }
              if (lVar5 != 0) {
                xmlFreeAutomata(lVar5);
              }
              iVar3 = compareFiles(pcVar4,result);
              if (iVar3 != 0) {
                fprintf(_stderr,"Result for %s failed in %s\n",local_3310,result);
              }
              unlink(pcVar4);
              free(pcVar4);
              return (uint)(iVar3 != 0);
            }
          } while (local_3308[0] == '#');
          sVar7 = strlen(local_3308);
          if ((int)(uint)sVar7 < 1) {
LAB_0010bf9a:
            local_3308[(int)sVar7] = '\0';
            goto LAB_0010bf47;
          }
          uVar8 = (ulong)((uint)sVar7 & 0x7fffffff);
          while (((ulong)(byte)local_3308[uVar8 - 1] < 0x21 &&
                 ((0x100002600U >> ((ulong)(byte)local_3308[uVar8 - 1] & 0x3f) & 1) != 0))) {
            sVar7 = uVar8 - 1;
            bVar1 = uVar8 < 2;
            uVar8 = sVar7;
            if (bVar1) goto LAB_0010bf9a;
          }
          local_3308[uVar8 & 0xffffffff] = '\0';
          bVar11 = local_3308[1] ^ 0x20;
          if ((cVar2 == 't' && bVar11 == 0) && lVar5 != 0) {
            if ((byte)(local_3308[2] - 0x30U) < 10) {
              iVar12 = 0;
              pcVar6 = local_3308 + 2;
              cVar2 = local_3308[2];
              do {
                iVar12 = (uint)(byte)(cVar2 - 0x30) + iVar12 * 10;
                cVar2 = pcVar6[1];
                pcVar6 = pcVar6 + 1;
              } while ((byte)(cVar2 - 0x30U) < 10);
              lVar16 = (long)iVar12;
            }
            else {
              lVar16 = 0;
              pcVar6 = local_3308 + 2;
              cVar2 = local_3308[2];
            }
            if (cVar2 == ' ') {
              lVar9 = local_1f78[lVar16];
              if (lVar9 == 0) {
                lVar9 = xmlAutomataNewState(lVar5);
                local_1f78[lVar16] = lVar9;
              }
              cVar2 = pcVar6[1];
              if ((byte)(cVar2 - 0x30U) < 10) {
                iVar12 = 0;
                do {
                  iVar12 = (uint)(byte)(cVar2 - 0x30) + iVar12 * 10;
                  cVar2 = pcVar6[2];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
                lVar13 = (long)iVar12;
              }
              else {
                lVar13 = 0;
              }
              if (cVar2 == ' ') {
                lVar10 = local_1f78[lVar13];
                if (lVar10 == 0) {
                  lVar10 = xmlAutomataNewState(lVar5,lVar9);
                  local_1f78[lVar13] = lVar10;
                  lVar9 = local_1f78[lVar16];
                }
                xmlAutomataNewTransition(lVar5,lVar9,lVar10,pcVar6 + 2);
                goto LAB_0010bf47;
              }
            }
          }
          else {
            if ((cVar2 == 'e' && bVar11 == 0) && lVar5 != 0) {
              if ((byte)(local_3308[2] - 0x30U) < 10) {
                iVar12 = 0;
                pcVar6 = local_3308 + 2;
                cVar2 = local_3308[2];
                do {
                  iVar12 = (uint)(byte)(cVar2 - 0x30) + iVar12 * 10;
                  cVar2 = pcVar6[1];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
                lVar16 = (long)iVar12;
              }
              else {
                lVar16 = 0;
                pcVar6 = local_3308 + 2;
                cVar2 = local_3308[2];
              }
              if (cVar2 != ' ') goto LAB_0010c59d;
              lVar9 = local_1f78[lVar16];
              if (lVar9 == 0) {
                lVar9 = xmlAutomataNewState(lVar5);
                local_1f78[lVar16] = lVar9;
              }
              cVar2 = pcVar6[1];
              if ((byte)(cVar2 - 0x30U) < 10) {
                pcVar6 = pcVar6 + 2;
                iVar12 = 0;
                do {
                  iVar12 = (uint)(byte)(cVar2 - 0x30) + iVar12 * 10;
                  cVar2 = *pcVar6;
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
                lVar13 = (long)iVar12;
              }
              else {
                lVar13 = 0;
              }
              lVar10 = local_1f78[lVar13];
              if (lVar10 == 0) {
                lVar10 = xmlAutomataNewState(lVar5,lVar9);
                local_1f78[lVar13] = lVar10;
                lVar9 = local_1f78[lVar16];
              }
              xmlAutomataNewEpsilon(lVar5,lVar9,lVar10);
              goto LAB_0010bf47;
            }
            if ((cVar2 == 'f' && bVar11 == 0) && lVar5 != 0) {
              uVar8 = 0;
              if ((byte)(local_3308[2] - 0x30U) < 10) {
                uVar8 = 0;
                pcVar6 = local_3308 + 3;
                cVar2 = local_3308[2];
                do {
                  uVar8 = (ulong)((uint)(byte)(cVar2 - 0x30) + (int)uVar8 * 10);
                  cVar2 = *pcVar6;
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
              }
              if (local_1f78[(int)uVar8] == 0) {
                fprintf(_stderr,"Bad state %d : %s\n",uVar8,local_3308);
                goto LAB_0010c5c9;
              }
              xmlAutomataSetFinalState(lVar5);
              goto LAB_0010bf47;
            }
            if ((cVar2 != 'c' || bVar11 != 0) || lVar5 == 0) {
              if ((local_3308[1] == 0x2d && cVar2 == '-') && lVar5 != 0) {
                local_3348 = xmlAutomataCompile(lVar5);
                xmlFreeAutomata(lVar5);
                lVar5 = 0;
                if (local_3348 != 0) goto LAB_0010bf47;
                automataTest_cold_1();
                local_3348 = 0;
                lVar5 = 0;
                goto LAB_0010c5c9;
              }
              if (local_3308[1] != 0x3e || cVar2 != '=') {
                if (local_3348 == 0) {
                  fprintf(_stderr,"Unexpected line %s\n",local_3308);
                  local_3348 = 0;
                }
                else {
                  if (local_3328 == 0) {
                    local_3328 = xmlRegNewExecCtxt(local_3348,0,0);
                  }
                  iVar3 = xmlRegExecPushString(local_3328,local_3308,0);
                }
                goto LAB_0010bf47;
              }
              if (local_3348 == 0) {
                fwrite("=> failed not compiled\n",0x17,1,__s);
                goto LAB_0010bf35;
              }
              if (local_3328 == 0) {
                local_3328 = xmlRegNewExecCtxt(local_3348,0,0);
              }
              if (iVar3 == 0) {
                iVar3 = xmlRegExecPushString(local_3328,0,0);
              }
              if (iVar3 == 1) {
                sVar7 = 10;
                pcVar6 = "=> Passed\n";
LAB_0010c516:
                fwrite(pcVar6,sVar7,1,__s);
              }
              else {
                if (iVar3 + 1U < 2) {
                  sVar7 = 10;
                  pcVar6 = "=> Failed\n";
                  goto LAB_0010c516;
                }
                if (iVar3 < 0) {
                  sVar7 = 9;
                  pcVar6 = "=> Error\n";
                  goto LAB_0010c516;
                }
              }
              xmlRegFreeExecCtxt(local_3328);
              local_3328 = 0;
              goto LAB_0010bf3e;
            }
            if ((byte)(local_3308[2] - 0x30U) < 10) {
              iVar12 = 0;
              pcVar6 = local_3308 + 2;
              cVar2 = local_3308[2];
              do {
                iVar12 = (uint)(byte)(cVar2 - 0x30) + iVar12 * 10;
                cVar2 = pcVar6[1];
                pcVar6 = pcVar6 + 1;
              } while ((byte)(cVar2 - 0x30U) < 10);
              lVar16 = (long)iVar12;
            }
            else {
              lVar16 = 0;
              pcVar6 = local_3308 + 2;
              cVar2 = local_3308[2];
            }
            if (cVar2 == ' ') {
              if (local_1f78[lVar16] == 0) {
                lVar9 = xmlAutomataNewState(lVar5);
                local_1f78[lVar16] = lVar9;
              }
              cVar2 = pcVar6[1];
              if ((byte)(cVar2 - 0x30U) < 10) {
                iVar12 = 0;
                do {
                  iVar12 = (uint)(byte)(cVar2 - 0x30) + iVar12 * 10;
                  cVar2 = pcVar6[2];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
                lVar9 = (long)iVar12;
              }
              else {
                lVar9 = 0;
              }
              if (cVar2 != ' ') goto LAB_0010c59d;
              lVar13 = local_1f78[lVar9];
              if (lVar13 == 0) {
                lVar13 = xmlAutomataNewState(lVar5);
                local_1f78[lVar9] = lVar13;
              }
              cVar2 = pcVar6[2];
              pcVar6 = pcVar6 + 2;
              iVar12 = 0;
              if ((byte)(cVar2 - 0x30U) < 10) {
                iVar12 = 0;
                do {
                  iVar12 = (uint)(byte)(cVar2 - 0x30) + iVar12 * 10;
                  cVar2 = pcVar6[1];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
              }
              if (cVar2 != ' ') goto LAB_0010c59d;
              cVar2 = pcVar6[1];
              iVar17 = 0;
              if ((byte)(cVar2 - 0x30U) < 10) {
                iVar17 = 0;
                do {
                  iVar17 = (uint)(byte)(cVar2 - 0x30) + iVar17 * 10;
                  cVar2 = pcVar6[2];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
              }
              if (cVar2 == ' ') {
                xmlAutomataNewCountTrans(lVar5,local_1f78[lVar16],lVar13,pcVar6 + 2,iVar12,iVar17);
                goto LAB_0010bf47;
              }
            }
          }
LAB_0010c59d:
          fprintf(_stderr,"Bad line %s\n",local_3308);
          goto LAB_0010c5c9;
        }
        automataTest_cold_2();
      }
    }
  }
  return -1;
}

Assistant:

static int
automataTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED, int options ATTRIBUTE_UNUSED) {
    FILE *input, *output;
    char *temp;
    char expr[5000];
    int len;
    int ret;
    int i;
    int res = 0;
    xmlAutomataPtr am;
    xmlAutomataStatePtr states[1000];
    xmlRegexpPtr regexp = NULL;
    xmlRegExecCtxtPtr exec = NULL;

    nb_tests++;

    for (i = 0;i<1000;i++)
	states[i] = NULL;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    am = xmlNewAutomata();
    if (am == NULL) {
        fprintf(stderr,
		"Cannot create automata\n");
	fclose(input);
	return(-1);
    }
    states[0] = xmlAutomataGetInitState(am);
    if (states[0] == NULL) {
        fprintf(stderr,
		"Cannot get start state\n");
	xmlFreeAutomata(am);
	fclose(input);
	return(-1);
    }
    ret = 0;

    while (fgets(expr, 4500, input) != NULL) {
	if (expr[0] == '#')
	    continue;
	len = strlen(expr);
	len--;
	while ((len >= 0) &&
	       ((expr[len] == '\n') || (expr[len] == '\t') ||
		(expr[len] == '\r') || (expr[len] == ' '))) len--;
	expr[len + 1] = 0;
	if (len >= 0) {
	    if ((am != NULL) && (expr[0] == 't') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		xmlAutomataNewTransition(am, states[from], states[to],
			                 BAD_CAST ptr, NULL);
	    } else if ((am != NULL) && (expr[0] == 'e') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		xmlAutomataNewEpsilon(am, states[from], states[to]);
	    } else if ((am != NULL) && (expr[0] == 'f') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int state;

		state = scanNumber(&ptr);
		if (states[state] == NULL) {
		    fprintf(stderr,
			    "Bad state %d : %s\n", state, expr);
		    break;
		}
		xmlAutomataSetFinalState(am, states[state]);
	    } else if ((am != NULL) && (expr[0] == 'c') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;
		int min, max;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		min = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		max = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		xmlAutomataNewCountTrans(am, states[from], states[to],
			                 BAD_CAST ptr, min, max, NULL);
	    } else if ((am != NULL) && (expr[0] == '-') && (expr[1] == '-')) {
		/* end of the automata */
		regexp = xmlAutomataCompile(am);
		xmlFreeAutomata(am);
		am = NULL;
		if (regexp == NULL) {
		    fprintf(stderr,
			    "Failed to compile the automata");
		    break;
		}
	    } else if ((expr[0] == '=') && (expr[1] == '>')) {
		if (regexp == NULL) {
		    fprintf(output, "=> failed not compiled\n");
		} else {
		    if (exec == NULL)
			exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		    if (ret == 0) {
			ret = xmlRegExecPushString(exec, NULL, NULL);
		    }
		    if (ret == 1)
			fprintf(output, "=> Passed\n");
		    else if ((ret == 0) || (ret == -1))
			fprintf(output, "=> Failed\n");
		    else if (ret < 0)
			fprintf(output, "=> Error\n");
		    xmlRegFreeExecCtxt(exec);
		    exec = NULL;
		}
		ret = 0;
	    } else if (regexp != NULL) {
		if (exec == NULL)
		    exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		ret = xmlRegExecPushString(exec, BAD_CAST expr, NULL);
	    } else {
		fprintf(stderr,
			"Unexpected line %s\n", expr);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (regexp != NULL)
	xmlRegFreeRegexp(regexp);
    if (exec != NULL)
	xmlRegFreeExecCtxt(exec);
    if (am != NULL)
	xmlFreeAutomata(am);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}